

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

UCalendarWeekdayType __thiscall
icu_63::Calendar::getDayOfWeekType(Calendar *this,UCalendarDaysOfWeek dayOfWeek,UErrorCode *status)

{
  UCalendarDaysOfWeek UVar1;
  UCalendarDaysOfWeek UVar2;
  UCalendarWeekdayType UVar3;
  
  UVar3 = UCAL_WEEKDAY;
  if (U_ZERO_ERROR < *status) {
    return UVar3;
  }
  if (dayOfWeek + ~UCAL_SATURDAY < 0xfffffff9) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return UVar3;
  }
  UVar1 = this->fWeekendOnset;
  UVar2 = this->fWeekendCease;
  if (UVar1 == UVar2) {
    if (UVar1 != dayOfWeek) {
      return UVar3;
    }
  }
  else {
    if ((int)UVar1 < (int)UVar2) {
      if ((int)UVar2 < (int)dayOfWeek || (int)dayOfWeek < (int)UVar1) {
        return UVar3;
      }
    }
    else if ((int)dayOfWeek < (int)UVar1 && (int)UVar2 < (int)dayOfWeek) {
      return UVar3;
    }
    if (UVar1 != dayOfWeek) {
      if (UVar2 == dayOfWeek) {
        return (uint)(this->fWeekendCeaseMillis < 86400000) * 2 + UCAL_WEEKEND;
      }
      return UCAL_WEEKEND;
    }
  }
  return UCAL_WEEKEND_ONSET - (this->fWeekendOnsetMillis == 0);
}

Assistant:

UCalendarWeekdayType
Calendar::getDayOfWeekType(UCalendarDaysOfWeek dayOfWeek, UErrorCode &status) const
{
    if (U_FAILURE(status)) {
        return UCAL_WEEKDAY;
    }
    if (dayOfWeek < UCAL_SUNDAY || dayOfWeek > UCAL_SATURDAY) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return UCAL_WEEKDAY;
    }
    if (fWeekendOnset == fWeekendCease) {
        if (dayOfWeek != fWeekendOnset)
            return UCAL_WEEKDAY;
        return (fWeekendOnsetMillis == 0) ? UCAL_WEEKEND : UCAL_WEEKEND_ONSET;
    }
    if (fWeekendOnset < fWeekendCease) {
        if (dayOfWeek < fWeekendOnset || dayOfWeek > fWeekendCease) {
            return UCAL_WEEKDAY;
        }
    } else {
        if (dayOfWeek > fWeekendCease && dayOfWeek < fWeekendOnset) {
            return UCAL_WEEKDAY;
        }
    }
    if (dayOfWeek == fWeekendOnset) {
        return (fWeekendOnsetMillis == 0) ? UCAL_WEEKEND : UCAL_WEEKEND_ONSET;
    }
    if (dayOfWeek == fWeekendCease) {
        return (fWeekendCeaseMillis >= 86400000) ? UCAL_WEEKEND : UCAL_WEEKEND_CEASE;
    }
    return UCAL_WEEKEND;
}